

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawCircleLines(int centerX,int centerY,float radius,Color color)

{
  float fVar1;
  float fVar2;
  undefined4 local_1c;
  int i;
  float radius_local;
  int centerY_local;
  int centerX_local;
  Color color_local;
  
  rlCheckRenderBatchLimit(0x48);
  rlBegin(1);
  centerY_local._0_1_ = color.r;
  centerY_local._1_1_ = color.g;
  centerY_local._2_1_ = color.b;
  centerY_local._3_1_ = color.a;
  rlColor4ub((uchar)centerY_local,centerY_local._1_1_,centerY_local._2_1_,centerY_local._3_1_);
  for (local_1c = 0; local_1c < 0x168; local_1c = local_1c + 10) {
    fVar1 = sinf((float)local_1c * 0.017453292);
    fVar2 = cosf((float)local_1c * 0.017453292);
    rlVertex2f(fVar1 * radius + (float)centerX,fVar2 * radius + (float)centerY);
    fVar1 = sinf((float)(local_1c + 10) * 0.017453292);
    fVar2 = cosf((float)(local_1c + 10) * 0.017453292);
    rlVertex2f(fVar1 * radius + (float)centerX,fVar2 * radius + (float)centerY);
  }
  rlEnd();
  return;
}

Assistant:

void DrawCircleLines(int centerX, int centerY, float radius, Color color)
{
    rlCheckRenderBatchLimit(2*36);

    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);

        // NOTE: Circle outline is drawn pixel by pixel every degree (0 to 360)
        for (int i = 0; i < 360; i += 10)
        {
            rlVertex2f(centerX + sinf(DEG2RAD*i)*radius, centerY + cosf(DEG2RAD*i)*radius);
            rlVertex2f(centerX + sinf(DEG2RAD*(i + 10))*radius, centerY + cosf(DEG2RAD*(i + 10))*radius);
        }
    rlEnd();
}